

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Maybe<const_kj::ReadableDirectory_&> __thiscall
capnp::compiler::CompilerMain::getSourceDirectory
          (CompilerMain *this,StringPtr pathStr,bool isSourcePrefix)

{
  HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory> *this_00;
  PathPtr other;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Maybe<capnp::compiler::CompilerMain::SourceDirectory_&> MVar4;
  ReadableDirectory *key;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *params_1;
  size_t extraout_RDX;
  StringPtr *params;
  String prefix;
  Path path;
  OwnOwn<const_kj::ReadableDirectory> dir;
  PathPtr cwd;
  undefined1 local_119 [9];
  ReadableDirectory *pRStack_110;
  ArrayDisposer *pAStack_108;
  Array<kj::String> local_f8;
  Own<const_kj::ReadableDirectory> local_e0;
  StringPtr local_d0;
  PathPtr local_c0;
  Array<char> local_b0;
  SourceDirectory local_98;
  Array<kj::String> local_80;
  SourceDirectory local_68;
  Array<kj::String> local_50;
  StringPtr local_38;
  undefined4 extraout_var_00;
  
  local_d0.content.size_ = pathStr.content.size_;
  local_d0.content.ptr = pathStr.content.ptr;
  iVar3 = (*((this->disk).ptr)->_vptr_Filesystem[2])();
  local_c0.parts.ptr = (String *)CONCAT44(extraout_var,iVar3);
  local_c0.parts.size_ = extraout_RDX;
  kj::PathPtr::eval((Path *)&local_f8,&local_c0,pathStr);
  if ((char *)local_f8.size_ == (char *)0x0) {
    iVar3 = (**((this->disk).ptr)->_vptr_Filesystem)();
    key = (ReadableDirectory *)CONCAT44(extraout_var_00,iVar3);
  }
  else {
    this_00 = &this->sourceDirectories;
    MVar4 = kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::find<kj::Path&>
                      ((HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory> *)this_00,
                       (Path *)&local_f8);
    if (MVar4.ptr == (SourceDirectory *)0x0) {
      other.parts.size_ = local_c0.parts.size_;
      other.parts.ptr = local_c0.parts.ptr;
      bVar2 = kj::Path::operator==((Path *)&local_f8,other);
      if (bVar2) {
        iVar3 = (*((this->disk).ptr)->_vptr_Filesystem[1])();
        key = (ReadableDirectory *)CONCAT44(extraout_var_01,iVar3);
        if (isSourcePrefix) {
          local_119._1_8_ = &kj::NullDisposer::instance;
          local_50.ptr = local_f8.ptr;
          local_50.size_ = local_f8.size_;
          local_50.disposer = local_f8.disposer;
          local_f8.ptr = (String *)0x0;
          local_f8.size_ = 0;
          local_68.dir.disposer = (Disposer *)&kj::NullDisposer::instance;
          pRStack_110 = (ReadableDirectory *)0x0;
          local_68.dir.ptr = key;
          local_68.isSourcePrefix = isSourcePrefix;
          kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::insert
                    (this_00,(Path *)&local_50,&local_68);
          kj::Own<const_kj::ReadableDirectory>::dispose(&local_68.dir);
          kj::Array<kj::String>::~Array(&local_50);
          kj::Own<const_kj::ReadableDirectory>::dispose
                    ((Own<const_kj::ReadableDirectory> *)(local_119 + 1));
        }
      }
      else {
        iVar3 = (**((this->disk).ptr)->_vptr_Filesystem)();
        params_1 = (char *)local_f8.size_;
        (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x58))
                  (local_119 + 1,(long *)CONCAT44(extraout_var_02,iVar3),local_f8.ptr);
        key = pRStack_110;
        uVar1 = local_119._1_8_;
        local_e0.disposer = (Disposer *)local_119._1_8_;
        local_e0.ptr = pRStack_110;
        pRStack_110 = (ReadableDirectory *)0x0;
        kj::Own<const_kj::ReadableDirectory>::dispose
                  ((Own<const_kj::ReadableDirectory> *)(local_119 + 1));
        if (key != (ReadableDirectory *)0x0) {
          local_80.ptr = local_f8.ptr;
          local_80.size_ = local_f8.size_;
          local_80.disposer = local_f8.disposer;
          local_f8.ptr = (String *)0x0;
          local_f8.size_ = 0;
          local_98.dir.disposer = (Disposer *)uVar1;
          local_98.dir.ptr = key;
          local_e0.ptr = (ReadableDirectory *)0x0;
          local_98.isSourcePrefix = isSourcePrefix;
          kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::insert
                    (this_00,(Path *)&local_80,&local_98);
          kj::Own<const_kj::ReadableDirectory>::dispose(&local_98.dir);
          kj::Array<kj::String>::~Array(&local_80);
          local_38.content.ptr = "/";
          local_38.content.size_ = 2;
          bVar2 = kj::StringPtr::endsWith(&local_d0,&local_38);
          if (bVar2) {
            kj::str<kj::StringPtr&>((String *)(local_119 + 1),(kj *)&local_d0,params);
          }
          else {
            local_119[0] = 0x2f;
            kj::str<kj::StringPtr&,char>
                      ((String *)(local_119 + 1),(kj *)&local_d0,(StringPtr *)local_119,params_1);
          }
          local_b0.ptr = (char *)local_119._1_8_;
          local_b0.size_ = (size_t)pRStack_110;
          local_b0.disposer = pAStack_108;
          local_119._1_8_ = (Disposer *)0x0;
          pRStack_110 = (ReadableDirectory *)0x0;
          kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::insert
                    (&this->dirPrefixes,key,(String *)&local_b0);
          kj::Array<char>::~Array(&local_b0);
          kj::Array<char>::~Array((Array<char> *)(local_119 + 1));
        }
        kj::Own<const_kj::ReadableDirectory>::dispose(&local_e0);
      }
    }
    else {
      (MVar4.ptr)->isSourcePrefix = (bool)((MVar4.ptr)->isSourcePrefix | isSourcePrefix);
      key = ((MVar4.ptr)->dir).ptr;
    }
  }
  kj::Array<kj::String>::~Array(&local_f8);
  return (Maybe<const_kj::ReadableDirectory_&>)key;
}

Assistant:

kj::Maybe<const kj::ReadableDirectory&> getSourceDirectory(
      kj::StringPtr pathStr, bool isSourcePrefix) {
    auto cwd = disk->getCurrentPath();
    auto path = cwd.evalNative(pathStr);

    if (path.size() == 0) return disk->getRoot();

    KJ_IF_MAYBE(sdir, sourceDirectories.find(path)) {
      sdir->isSourcePrefix = sdir->isSourcePrefix || isSourcePrefix;
      return *sdir->dir;
    }

    if (path == cwd) {
      // Slight hack if the working directory is explicitly specified:
      // - We want to avoid opening a new copy of the working directory, as tryOpenSubdir() would
      //   do.
      // - If isSourcePrefix is true, we need to add it to sourceDirectories to track that.
      //   Otherwise we don't need to add it at all.
      // - We do not need to add it to dirPrefixes since the cwd is already handled in
      //   getDisplayName().
      auto& result = disk->getCurrent();
      if (isSourcePrefix) {
        kj::Own<const kj::ReadableDirectory> fakeOwn(&result, kj::NullDisposer::instance);
        sourceDirectories.insert(kj::mv(path), { kj::mv(fakeOwn), isSourcePrefix });
      }
      return result;
    }

    KJ_IF_MAYBE(dir, disk->getRoot().tryOpenSubdir(path)) {
      auto& result = *dir->get();
      sourceDirectories.insert(kj::mv(path), { kj::mv(*dir), isSourcePrefix });
#if _WIN32
      kj::String prefix = pathStr.endsWith("/") || pathStr.endsWith("\\")
                        ? kj::str(pathStr) : kj::str(pathStr, '\\');
#else
      kj::String prefix = pathStr.endsWith("/") ? kj::str(pathStr) : kj::str(pathStr, '/');
#endif
      dirPrefixes.insert(&result, kj::mv(prefix));
      return result;
    } else {
      return nullptr;
    }
  }